

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::SimplePathIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SimplePathIntegrator *this)

{
  bool *in_R9;
  
  StringPrintf<int_const&,bool_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ SimplePathIntegrator maxDepth: %d sampleLights: %s sampleBSDF: %s ]",
             (char *)&this->maxDepth,(int *)&this->sampleLights,&this->sampleBSDF,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string SimplePathIntegrator::ToString() const {
    return StringPrintf("[ SimplePathIntegrator maxDepth: %d sampleLights: %s "
                        "sampleBSDF: %s ]",
                        maxDepth, sampleLights, sampleBSDF);
}